

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.c
# Opt level: O2

wchar_t tok_wline(TokenizerW *tok,LineInfoW *line,wchar_t *argc,wchar_t ***argv,wchar_t *cursorc,
                 wchar_t *cursoro)

{
  wchar_t wVar1;
  size_t sVar2;
  wchar_t *pwVar3;
  wchar_t **ppwVar4;
  size_t sVar5;
  wchar_t wVar6;
  ulong uVar7;
  wchar_t *pwVar8;
  long lVar9;
  wchar_t local_54;
  
  pwVar8 = line->buffer;
  local_54 = L'\xffffffff';
  uVar7 = 0xffffffff;
LAB_001113bf:
  if (line->lastchar <= pwVar8) {
    pwVar8 = anon_var_dwarf_16e07 + 3;
  }
  if (pwVar8 == line->cursor) {
    local_54 = (wchar_t)tok->argc;
    uVar7 = (ulong)((long)tok->wptr - (long)tok->wstart) >> 2;
  }
  wVar6 = (wchar_t)uVar7;
  wVar1 = *pwVar8;
  if (wVar1 == L'\0') {
    switch(tok->quote) {
    case Q_none:
      if ((tok->flags & 2U) != 0) {
        tok->flags = tok->flags & 0xfffffffd;
        return L'\x03';
      }
switchD_00111462_caseD_0:
      if ((local_54 == L'\xffffffff') && (wVar6 == L'\xffffffff')) {
        local_54 = (wchar_t)tok->argc;
        wVar6 = (wchar_t)((ulong)((long)tok->wptr - (long)tok->wstart) >> 2);
      }
      if (cursorc != (wchar_t *)0x0) {
        *cursorc = local_54;
      }
      if (cursoro != (wchar_t *)0x0) {
        *cursoro = wVar6;
      }
      tok_wfinish(tok);
      *argv = tok->argv;
      *argc = (wchar_t)tok->argc;
      return L'\0';
    case Q_single:
    case Q_double:
      return tok->quote;
    case Q_one:
      goto switchD_0011142e_caseD_3;
    case Q_doubleone:
      goto switchD_0011142e_caseD_4;
    default:
      return L'\xffffffff';
    }
  }
  if (wVar1 == L'\n') {
    wVar1 = tok->flags;
    tok->flags = wVar1 & 0xfffffffd;
    switch(tok->quote) {
    case Q_none:
      goto switchD_00111462_caseD_0;
    case Q_single:
    case Q_double:
      goto switchD_0011142e_caseD_2;
    case Q_one:
      tok->flags = wVar1 | 2;
switchD_0011142e_caseD_1:
      tok->quote = Q_none;
      break;
    case Q_doubleone:
      tok->flags = wVar1 | 2;
switchD_001114c9_caseD_0:
      tok->quote = Q_double;
      break;
    default:
      return L'\0';
    }
    goto LAB_0011154a;
  }
  if (wVar1 == L'\"') {
    tok->flags = (tok->flags & 0xfffffffcU) + L'\x01';
    switch(tok->quote) {
    case Q_none:
      goto switchD_001114c9_caseD_0;
    case Q_single:
      goto switchD_0011142e_caseD_2;
    case Q_double:
      goto switchD_0011142e_caseD_1;
    case Q_one:
      goto switchD_0011142e_caseD_3;
    case Q_doubleone:
      goto switchD_0011142e_caseD_4;
    default:
      return L'\xffffffff';
    }
  }
  if (wVar1 == L'\\') {
    tok->flags = (tok->flags & 0xfffffffcU) + L'\x01';
    switch(tok->quote) {
    case Q_none:
      tok->quote = Q_one;
      break;
    case Q_single:
      goto switchD_0011142e_caseD_2;
    case Q_double:
      tok->quote = Q_doubleone;
      break;
    case Q_one:
      wVar1 = *pwVar8;
      pwVar3 = tok->wptr;
      tok->wptr = pwVar3 + 1;
      *pwVar3 = wVar1;
      goto switchD_0011142e_caseD_1;
    case Q_doubleone:
      goto switchD_0011142e_caseD_4;
    default:
      goto LAB_00111685;
    }
  }
  else {
    if (wVar1 == L'\'') {
      tok->flags = (tok->flags & 0xfffffffcU) + L'\x01';
      switch(tok->quote) {
      case Q_none:
        tok->quote = Q_single;
        break;
      case Q_single:
        goto switchD_0011142e_caseD_1;
      case Q_double:
        goto switchD_0011142e_caseD_2;
      case Q_one:
        goto switchD_0011142e_caseD_3;
      case Q_doubleone:
        goto switchD_0011142e_caseD_4;
      default:
        return L'\xffffffff';
      }
      goto LAB_0011154a;
    }
    *(byte *)&tok->flags = (byte)tok->flags & 0xfd;
    switch(tok->quote) {
    case Q_none:
      wVar1 = *pwVar8;
      pwVar3 = wcschr(tok->ifs,wVar1);
      if (pwVar3 == (wchar_t *)0x0) {
        pwVar3 = tok->wptr;
        tok->wptr = pwVar3 + 1;
        *pwVar3 = wVar1;
      }
      else {
        tok_wfinish(tok);
      }
      break;
    case Q_single:
    case Q_double:
      goto switchD_0011142e_caseD_2;
    case Q_one:
switchD_0011142e_caseD_3:
      tok->quote = Q_none;
      goto switchD_0011142e_caseD_2;
    case Q_doubleone:
      pwVar3 = tok->wptr;
      *pwVar3 = L'\\';
      tok->quote = Q_double;
      wVar1 = *pwVar8;
      tok->wptr = pwVar3 + 2;
      pwVar3[1] = wVar1;
      break;
    default:
      goto LAB_00111685;
    }
  }
LAB_0011154a:
  if (tok->wmax + -4 <= tok->wptr) {
    lVar9 = (long)tok->wmax - (long)tok->wspace >> 2;
    pwVar3 = (wchar_t *)realloc(tok->wspace,lVar9 * 4 + 0x50);
    if (pwVar3 == (wchar_t *)0x0) {
      return L'\xffffffff';
    }
    if (pwVar3 != tok->wspace) {
      sVar2 = tok->argc;
      for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
        tok->argv[sVar5] = (wchar_t *)(((long)tok->argv[sVar5] - (long)tok->wspace) + (long)pwVar3);
      }
      tok->wptr = (wchar_t *)(((long)tok->wptr - (long)tok->wspace) + (long)pwVar3);
      tok->wstart = (wchar_t *)(((long)tok->wstart - (long)tok->wspace) + (long)pwVar3);
      tok->wspace = pwVar3;
    }
    tok->wmax = pwVar3 + lVar9 + 0x14;
  }
  sVar2 = tok->amax;
  if (sVar2 - 4 <= tok->argc) {
    tok->amax = sVar2 + 10;
    ppwVar4 = (wchar_t **)realloc(tok->argv,sVar2 * 8 + 0x50);
    if (ppwVar4 == (wchar_t **)0x0) {
      tok->amax = tok->amax - 10;
LAB_00111685:
      return L'\xffffffff';
    }
    tok->argv = ppwVar4;
  }
  pwVar8 = pwVar8 + 1;
  goto LAB_001113bf;
switchD_0011142e_caseD_4:
  tok->quote = Q_double;
switchD_0011142e_caseD_2:
  wVar1 = *pwVar8;
  pwVar3 = tok->wptr;
  tok->wptr = pwVar3 + 1;
  *pwVar3 = wVar1;
  goto LAB_0011154a;
}

Assistant:

int
FUN(tok,line)(TYPE(Tokenizer) *tok, const TYPE(LineInfo) *line,
    int *argc, const Char ***argv, int *cursorc, int *cursoro)
{
	const Char *ptr;
	int cc, co;

	cc = co = -1;
	ptr = line->buffer;
	for (ptr = line->buffer; ;ptr++) {
		if (ptr >= line->lastchar)
			ptr = STR("");
		if (ptr == line->cursor) {
			cc = (int)tok->argc;
			co = (int)(tok->wptr - tok->wstart);
		}
		switch (*ptr) {
		case '\'':
			tok->flags |= TOK_KEEP;
			tok->flags &= ~TOK_EAT;
			switch (tok->quote) {
			case Q_none:
				tok->quote = Q_single;	/* Enter single quote
							 * mode */
				break;

			case Q_single:	/* Exit single quote mode */
				tok->quote = Q_none;
				break;

			case Q_one:	/* Quote this ' */
				tok->quote = Q_none;
				*tok->wptr++ = *ptr;
				break;

			case Q_double:	/* Stay in double quote mode */
				*tok->wptr++ = *ptr;
				break;

			case Q_doubleone:	/* Quote this ' */
				tok->quote = Q_double;
				*tok->wptr++ = *ptr;
				break;

			default:
				return -1;
			}
			break;

		case '"':
			tok->flags &= ~TOK_EAT;
			tok->flags |= TOK_KEEP;
			switch (tok->quote) {
			case Q_none:	/* Enter double quote mode */
				tok->quote = Q_double;
				break;

			case Q_double:	/* Exit double quote mode */
				tok->quote = Q_none;
				break;

			case Q_one:	/* Quote this " */
				tok->quote = Q_none;
				*tok->wptr++ = *ptr;
				break;

			case Q_single:	/* Stay in single quote mode */
				*tok->wptr++ = *ptr;
				break;

			case Q_doubleone:	/* Quote this " */
				tok->quote = Q_double;
				*tok->wptr++ = *ptr;
				break;

			default:
				return -1;
			}
			break;

		case '\\':
			tok->flags |= TOK_KEEP;
			tok->flags &= ~TOK_EAT;
			switch (tok->quote) {
			case Q_none:	/* Quote next character */
				tok->quote = Q_one;
				break;

			case Q_double:	/* Quote next character */
				tok->quote = Q_doubleone;
				break;

			case Q_one:	/* Quote this, restore state */
				*tok->wptr++ = *ptr;
				tok->quote = Q_none;
				break;

			case Q_single:	/* Stay in single quote mode */
				*tok->wptr++ = *ptr;
				break;

			case Q_doubleone:	/* Quote this \ */
				tok->quote = Q_double;
				*tok->wptr++ = *ptr;
				break;

			default:
				return -1;
			}
			break;

		case '\n':
			tok->flags &= ~TOK_EAT;
			switch (tok->quote) {
			case Q_none:
				goto tok_line_outok;

			case Q_single:
			case Q_double:
				*tok->wptr++ = *ptr;	/* Add the return */
				break;

			case Q_doubleone:   /* Back to double, eat the '\n' */
				tok->flags |= TOK_EAT;
				tok->quote = Q_double;
				break;

			case Q_one:	/* No quote, more eat the '\n' */
				tok->flags |= TOK_EAT;
				tok->quote = Q_none;
				break;

			default:
				return 0;
			}
			break;

		case '\0':
			switch (tok->quote) {
			case Q_none:
				/* Finish word and return */
				if (tok->flags & TOK_EAT) {
					tok->flags &= ~TOK_EAT;
					return 3;
				}
				goto tok_line_outok;

			case Q_single:
				return 1;

			case Q_double:
				return 2;

			case Q_doubleone:
				tok->quote = Q_double;
				*tok->wptr++ = *ptr;
				break;

			case Q_one:
				tok->quote = Q_none;
				*tok->wptr++ = *ptr;
				break;

			default:
				return -1;
			}
			break;

		default:
			tok->flags &= ~TOK_EAT;
			switch (tok->quote) {
			case Q_none:
				if (Strchr(tok->ifs, *ptr) != NULL)
					FUN(tok,finish)(tok);
				else
					*tok->wptr++ = *ptr;
				break;

			case Q_single:
			case Q_double:
				*tok->wptr++ = *ptr;
				break;


			case Q_doubleone:
				*tok->wptr++ = '\\';
				tok->quote = Q_double;
				*tok->wptr++ = *ptr;
				break;

			case Q_one:
				tok->quote = Q_none;
				*tok->wptr++ = *ptr;
				break;

			default:
				return -1;

			}
			break;
		}

		if (tok->wptr >= tok->wmax - 4) {
			size_t size = (size_t)(tok->wmax - tok->wspace + WINCR);
			Char *s = tok_realloc(tok->wspace,
			    size * sizeof(*s));
			if (s == NULL)
				return -1;

			if (s != tok->wspace) {
				size_t i;
				for (i = 0; i < tok->argc; i++) {
				    tok->argv[i] =
					(tok->argv[i] - tok->wspace) + s;
				}
				tok->wptr = (tok->wptr - tok->wspace) + s;
				tok->wstart = (tok->wstart - tok->wspace) + s;
				tok->wspace = s;
			}
			tok->wmax = s + size;
		}
		if (tok->argc >= tok->amax - 4) {
			const Char **p;
			tok->amax += AINCR;
			p = tok_realloc(tok->argv, tok->amax * sizeof(*p));
			if (p == NULL) {
				tok->amax -= AINCR;
				return -1;
			}
			tok->argv = p;
		}
	}
 tok_line_outok:
	if (cc == -1 && co == -1) {
		cc = (int)tok->argc;
		co = (int)(tok->wptr - tok->wstart);
	}
	if (cursorc != NULL)
		*cursorc = cc;
	if (cursoro != NULL)
		*cursoro = co;
	FUN(tok,finish)(tok);
	*argv = tok->argv;
	*argc = (int)tok->argc;
	return 0;
}